

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  pointer ppTVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  Int32 IVar4;
  uint uVar5;
  char *pcVar6;
  pointer ppTVar7;
  uint uVar8;
  char *in_R8;
  string local_58;
  string local_38;
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(iteration + 1));
  }
  if (((FLAGS_gtest_filter_abi_cxx11_ == (char *)0x0) || (*FLAGS_gtest_filter_abi_cxx11_ != '*')) ||
     (FLAGS_gtest_filter_abi_cxx11_[1] != '\0')) {
    ColoredPrintf(COLOR_YELLOW,"Note: %s filter = %s\n","Google Test");
  }
  bVar3 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",false);
  if (bVar3) {
    IVar4 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
    pcVar6 = getenv("GTEST_TOTAL_SHARDS");
    ColoredPrintf(COLOR_YELLOW,"Note: This is test shard %d of %s.\n",(ulong)(IVar4 + 1),pcVar6);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    ColoredPrintf(COLOR_YELLOW,"Note: Randomizing tests\' orders with a seed of %d .\n",
                  (ulong)(uint)unit_test->impl_->random_seed_);
  }
  uVar8 = 0;
  ColoredPrintf(COLOR_GREEN,"[==========] ");
  uVar5 = UnitTestImpl::test_to_run_count(unit_test->impl_);
  FormatCountableNoun_abi_cxx11_(&local_58,(testing *)(ulong)uVar5,0x13da28,"tests",in_R8);
  _Var2._M_p = local_58._M_dataplus._M_p;
  ppTVar7 = (unit_test->impl_->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (unit_test->impl_->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar7 != ppTVar1) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (*ppTVar7)->should_run_;
      ppTVar7 = ppTVar7 + 1;
    } while (ppTVar7 != ppTVar1);
  }
  FormatCountableNoun_abi_cxx11_(&local_38,(testing *)(ulong)uVar8,0x13e14b,"test suites",in_R8);
  printf("Running %s from %s.\n",_Var2._M_p,local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  const char* const filter = GTEST_FLAG(filter).c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: %s filter = %s\n", GTEST_NAME_, filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const Int32 shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(COLOR_YELLOW,
                  "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG(shuffle)) {
    ColoredPrintf(COLOR_YELLOW,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  fflush(stdout);
}